

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::traversedashwordlistdashfindnext(Forth *this)

{
  int iVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  value_type *defnLook;
  uint i;
  SCell wid;
  uint nt;
  Forth *this_local;
  
  requireDStackDepth(this,1,"TRAVERSE-WORDLIST-FINDNEXT");
  defnLook._4_4_ = ForthStack<unsigned_int>::getTop(&this->dStack);
  if ((defnLook._4_4_ == 0) ||
     (sVar3 = std::vector<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
              ::size(&this->definitions), sVar3 <= defnLook._4_4_)) {
LAB_00121811:
    ForthStack<unsigned_int>::setTop(&this->dStack,0);
  }
  else {
    pvVar4 = std::vector<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
             ::operator[](&this->definitions,(ulong)defnLook._4_4_);
    iVar1 = pvVar4->searchOrder;
    do {
      defnLook._4_4_ = defnLook._4_4_ - 1;
      if (defnLook._4_4_ == 0) goto LAB_00121811;
      pvVar4 = std::
               vector<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>::
               operator[](&this->definitions,(ulong)defnLook._4_4_);
      bVar2 = Definition::isHidden(pvVar4);
    } while ((bVar2) || (pvVar4->searchOrder != iVar1));
    ForthStack<unsigned_int>::setTop(&this->dStack,pvVar4->numberInVector);
  }
  return;
}

Assistant:

void traversedashwordlistdashfindnext(){
					REQUIRE_DSTACK_DEPTH(1, "TRAVERSE-WORDLIST-FINDNEXT");
					auto nt = dStack.getTop(); 
					if(nt>0 && nt<definitions.size()){
						auto wid=definitions[nt].searchOrder;
						for (auto i = nt-1; i > 0 ; --i) {
							auto& defnLook = definitions[i];
							//if (!defn.isFindable())
							if (defnLook.isHidden())
								continue;
							if(defnLook.searchOrder==wid){
								dStack.setTop(defnLook.numberInVector);
								return;
							}
						}
					}
					dStack.setTop(0);	
		}